

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O2

void __thiscall
TPZFront<float>::STensorProductMTData::Run
          (STensorProductMTData *this,TPZVec<float> *AuxVecCol,TPZVec<float> *AuxVecRow)

{
  long lVar1;
  int i;
  long lVar2;
  
  this->fAuxVecCol = AuxVecCol;
  this->fAuxVecRow = AuxVecRow;
  this->fWorkDoneCount = 0;
  lVar1 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)(this->fThreads).
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->fThreads).
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3); lVar2 = lVar2 + 1)
  {
    TPZSemaphore::Post((TPZSemaphore *)((long)&((this->fWorkSem).fStore)->fCounter + lVar1));
    lVar1 = lVar1 + 0x60;
  }
  TPZSemaphore::Wait(&this->fWorkDoneSem);
  return;
}

Assistant:

void Run(TPZVec<TVar> &AuxVecCol, TPZVec<TVar> &AuxVecRow){
			this->fAuxVecCol = &AuxVecCol;
			this->fAuxVecRow = &AuxVecRow;
			this->fWorkDoneCount = 0;
			for(int i = 0; i < NThreads(); i++){
				fWorkSem[i].Post();
			}
      fWorkDoneSem.Wait();
		}